

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86AND(uchar *stream,x86Reg op1,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  uint uVar2;
  byte bVar3;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x72e,"int x86AND(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
  }
  bVar3 = 8 < (int)base | (8 < (int)index) * '\x02' | (8 < (int)op1) << 2 | (size == sQWORD) << 3;
  if (bVar3 != 0) {
    *stream = bVar3 | 0x40;
  }
  puVar1 = stream + (bVar3 != 0);
  *puVar1 = '#';
  uVar2 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,(int)regCode[op1]);
  return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86AND(unsigned char *stream, x86Reg op1, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, op1, index, base);
	*stream++ = 0x23;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[op1]);

	return int(stream - start);
}